

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

OrthographicCamera *
pbrt::OrthographicCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,FilmHandle *film,
          MediumHandle *medium,FileLoc *loc,Allocator alloc)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [64];
  vector<float,_std::allocator<float>_> sw;
  CameraBaseParameters cameraBaseParameters;
  Bounds2f local_718;
  Float local_708;
  Float local_704;
  vector<float,_std::allocator<float>_> local_700;
  undefined1 local_6e8 [16];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_6d0;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_6c8;
  CameraBaseParameters local_6c0;
  CameraBaseParameters local_370;
  undefined1 extraout_var_00 [60];
  
  local_6c8.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  local_6d0.bits =
       (medium->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  CameraBaseParameters::CameraBaseParameters
            (&local_370,cameraTransform,(FilmHandle *)&local_6c8,(MediumHandle *)&local_6d0,
             parameters,loc);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_6c0.cameraTransform.renderFromCamera.startTransform.m.m + 1);
  local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"lensradius","");
  local_704 = ParameterDictionary::GetOneFloat(parameters,(string *)&local_6c0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ != paVar3) {
    operator_delete((void *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_,
                    CONCAT71(local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1]._1_7_,
                             local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1][0].
                             _0_1_) + 1);
  }
  local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"focaldistance","");
  local_708 = ParameterDictionary::GetOneFloat(parameters,(string *)&local_6c0,1e+06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ != paVar3) {
    operator_delete((void *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_,
                    CONCAT71(local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1]._1_7_,
                             local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1][0].
                             _0_1_) + 1);
  }
  local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"frameaspectratio","");
  uVar1 = *(undefined8 *)
           ((film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits & 0xffffffffffff);
  auVar7._0_4_ = ParameterDictionary::GetOneFloat
                           (parameters,(string *)&local_6c0,
                            (float)(int)uVar1 / (float)(int)((ulong)uVar1 >> 0x20));
  auVar7._4_60_ = extraout_var_00;
  auVar5 = auVar7._0_16_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ != paVar3) {
    local_6e8 = auVar7._0_16_;
    operator_delete((void *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_,
                    CONCAT71(local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1]._1_7_,
                             local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1][0].
                             _0_1_) + 1);
    auVar5 = local_6e8;
  }
  fVar6 = auVar5._0_4_;
  if (fVar6 <= 1.0) {
    local_718.pMax.super_Tuple2<pbrt::Point2,_float>.x = 1.0;
    local_718.pMin.super_Tuple2<pbrt::Point2,_float>.y = -1.0 / fVar6;
    local_718.pMin.super_Tuple2<pbrt::Point2,_float>.x = -1.0;
    local_718.pMax.super_Tuple2<pbrt::Point2,_float>.y = 1.0 / fVar6;
  }
  else {
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(auVar5,auVar2);
    local_718.pMin.super_Tuple2<pbrt::Point2,_float>.y = -1.0;
    local_718.pMin.super_Tuple2<pbrt::Point2,_float>.x = auVar5._0_4_;
    local_718.pMax.super_Tuple2<pbrt::Point2,_float>.y = 1.0;
    local_718.pMax.super_Tuple2<pbrt::Point2,_float>.x = fVar6;
  }
  local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"screenwindow","");
  ParameterDictionary::GetFloatArray(&local_700,parameters,(string *)&local_6c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ != paVar3) {
    operator_delete((void *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_,
                    CONCAT71(local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1]._1_7_,
                             local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1][0].
                             _0_1_) + 1);
  }
  if (local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if ((long)local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      local_718.pMin.super_Tuple2<pbrt::Point2,_float>.y =
           local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      local_718.pMin.super_Tuple2<pbrt::Point2,_float>.x =
           *local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
      local_718.pMax.super_Tuple2<pbrt::Point2,_float>.y =
           local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[3];
      local_718.pMax.super_Tuple2<pbrt::Point2,_float>.x =
           local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[1];
    }
    else {
      local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0][2] = 0.0;
      local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0][3] = 0.0;
      local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1][0]._0_1_ = '\0';
      local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ = paVar3;
      detail::stringPrintfRecursive((string *)&local_6c0,"\"screenwindow\" should have four values")
      ;
      Error((FileLoc *)0x0,
            (char *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_ != paVar3) {
        operator_delete((void *)local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[0].
                                _0_8_,
                        CONCAT71(local_6c0.cameraTransform.renderFromCamera.startTransform.m.m[1].
                                 _1_7_,local_6c0.cameraTransform.renderFromCamera.startTransform.m.m
                                       [1][0]._0_1_) + 1);
      }
    }
  }
  iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x5a0,8);
  memcpy(&local_6c0,&local_370,0x340);
  local_6c0.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       local_370.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_6c0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_370.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  OrthographicCamera((OrthographicCamera *)CONCAT44(extraout_var,iVar4),&local_6c0,&local_718,
                     local_704,local_708);
  if (local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_700.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (OrthographicCamera *)CONCAT44(extraout_var,iVar4);
}

Assistant:

OrthographicCamera *OrthographicCamera::Create(const ParameterDictionary &parameters,
                                               const CameraTransform &cameraTransform,
                                               FilmHandle film, MediumHandle medium,
                                               const FileLoc *loc, Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    Float lensradius = parameters.GetOneFloat("lensradius", 0.f);
    Float focaldistance = parameters.GetOneFloat("focaldistance", 1e6f);
    Float frame =
        parameters.GetOneFloat("frameaspectratio", Float(film.FullResolution().x) /
                                                       Float(film.FullResolution().y));
    Bounds2f screen;
    if (frame > 1.f) {
        screen.pMin.x = -frame;
        screen.pMax.x = frame;
        screen.pMin.y = -1.f;
        screen.pMax.y = 1.f;
    } else {
        screen.pMin.x = -1.f;
        screen.pMax.x = 1.f;
        screen.pMin.y = -1.f / frame;
        screen.pMax.y = 1.f / frame;
    }
    std::vector<Float> sw = parameters.GetFloatArray("screenwindow");
    if (!sw.empty()) {
        if (sw.size() == 4) {
            screen.pMin.x = sw[0];
            screen.pMax.x = sw[1];
            screen.pMin.y = sw[2];
            screen.pMax.y = sw[3];
        } else
            Error("\"screenwindow\" should have four values");
    }
    return alloc.new_object<OrthographicCamera>(cameraBaseParameters, screen, lensradius,
                                                focaldistance);
}